

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  TargetType TVar2;
  string dir;
  string local_238;
  string f;
  cmAlphaNum local_1f8;
  string local_1c8;
  Names targetNames;
  Names local_e8;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  targetNames.Base._M_string_length = 0;
  targetNames.Base.field_2._M_local_buf[0] = '\0';
  targetNames.Output._M_dataplus._M_p = (pointer)&targetNames.Output.field_2;
  targetNames.Output._M_string_length = 0;
  targetNames.Output.field_2._M_local_buf[0] = '\0';
  targetNames.Real._M_dataplus._M_p = (pointer)&targetNames.Real.field_2;
  targetNames.Real._M_string_length = 0;
  targetNames.Real.field_2._M_local_buf[0] = '\0';
  targetNames.ImportLibrary._M_dataplus._M_p = (pointer)&targetNames.ImportLibrary.field_2;
  targetNames.ImportLibrary._M_string_length = 0;
  targetNames.ImportLibrary.field_2._M_local_buf[0] = '\0';
  targetNames.PDB._M_dataplus._M_p = (pointer)&targetNames.PDB.field_2;
  targetNames.PDB._M_string_length = 0;
  targetNames.PDB.field_2._M_local_buf[0] = '\0';
  targetNames.SharedObject._M_dataplus._M_p = (pointer)&targetNames.SharedObject.field_2;
  targetNames.SharedObject._M_string_length = 0;
  targetNames.SharedObject.field_2._M_local_buf[0] = '\0';
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames(&local_e8,this,config);
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) goto LAB_002db890;
    GetLibraryNames(&local_e8,this,config);
  }
  Names::operator=(&targetNames,&local_e8);
  Names::~Names(&local_e8);
  GetDirectory(&dir,this,config,RuntimeBinaryArtifact);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  if (targetNames.Output._M_string_length != 0) {
    local_e8.Base._M_dataplus._M_p = (pointer)dir._M_string_length;
    local_e8.Base._M_string_length = (size_type)dir._M_dataplus._M_p;
    local_1f8.View_._M_str = local_1f8.Digits_;
    local_1f8.View_._M_len = 1;
    local_1f8.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>
              (&local_238,(cmAlphaNum *)&local_e8,&local_1f8,&targetNames.Output);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.SharedObject._M_string_length != 0) {
    local_e8.Base._M_dataplus._M_p = (pointer)dir._M_string_length;
    local_e8.Base._M_string_length = (size_type)dir._M_dataplus._M_p;
    local_1f8.View_._M_str = local_1f8.Digits_;
    local_1f8.View_._M_len = 1;
    local_1f8.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>
              (&local_238,(cmAlphaNum *)&local_e8,&local_1f8,&targetNames.SharedObject);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.Real._M_string_length != 0) {
    local_e8.Base._M_dataplus._M_p = (pointer)dir._M_string_length;
    local_e8.Base._M_string_length = (size_type)dir._M_dataplus._M_p;
    local_1f8.View_._M_str = local_1f8.Digits_;
    local_1f8.View_._M_len = 1;
    local_1f8.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>(&local_238,(cmAlphaNum *)&local_e8,&local_1f8,&targetNames.Real);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.PDB._M_string_length != 0) {
    local_e8.Base._M_dataplus._M_p = (pointer)dir._M_string_length;
    local_e8.Base._M_string_length = (size_type)dir._M_dataplus._M_p;
    local_1f8.View_._M_str = local_1f8.Digits_;
    local_1f8.View_._M_len = 1;
    local_1f8.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>(&local_238,(cmAlphaNum *)&local_e8,&local_1f8,&targetNames.PDB);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (targetNames.ImportLibrary._M_string_length != 0) {
    GetDirectory(&local_1c8,this,config,ImportLibraryArtifact);
    local_e8.Base._M_dataplus._M_p = (pointer)local_1c8._M_string_length;
    local_e8.Base._M_string_length = (size_type)local_1c8._M_dataplus._M_p;
    local_1f8.View_._M_str = local_1f8.Digits_;
    local_1f8.View_._M_len = 1;
    local_1f8.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>
              (&local_238,(cmAlphaNum *)&local_e8,&local_1f8,&targetNames.ImportLibrary);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1c8);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&dir);
LAB_002db890:
  Names::~Names(&targetNames);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  cmGeneratorTarget::Names targetNames;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    targetNames = this->GetExecutableNames(config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames = this->GetLibraryNames(config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!targetNames.Output.empty()) {
    f = cmStrCat(dir, '/', targetNames.Output);
    gg->AddToManifest(f);
  }
  if (!targetNames.SharedObject.empty()) {
    f = cmStrCat(dir, '/', targetNames.SharedObject);
    gg->AddToManifest(f);
  }
  if (!targetNames.Real.empty()) {
    f = cmStrCat(dir, '/', targetNames.Real);
    gg->AddToManifest(f);
  }
  if (!targetNames.PDB.empty()) {
    f = cmStrCat(dir, '/', targetNames.PDB);
    gg->AddToManifest(f);
  }
  if (!targetNames.ImportLibrary.empty()) {
    f =
      cmStrCat(this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact),
               '/', targetNames.ImportLibrary);
    gg->AddToManifest(f);
  }
}